

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

termination_code
PDHG_Check_Primal_Infeasibility
          (CUPDLPwork *pdhg,cupdlp_float dPrimalInfeasObj,cupdlp_float dPrimalInfeasRes)

{
  termination_code primalCode;
  CUPDLPresobj *resobj;
  cupdlp_float dPrimalInfeasRes_local;
  cupdlp_float dPrimalInfeasObj_local;
  CUPDLPwork *pdhg_local;
  
  primalCode = FEASIBLE;
  if ((0.0 < dPrimalInfeasObj) && (dPrimalInfeasRes < pdhg->resobj->dFeasTol * dPrimalInfeasObj)) {
    primalCode = INFEASIBLE;
  }
  return primalCode;
}

Assistant:

termination_code PDHG_Check_Primal_Infeasibility(
    CUPDLPwork *pdhg, cupdlp_float dPrimalInfeasObj,
    cupdlp_float dPrimalInfeasRes) {
  CUPDLPresobj *resobj = pdhg->resobj;

  termination_code primalCode = FEASIBLE;

  if (dPrimalInfeasObj > 0.0) {
    if (dPrimalInfeasRes < resobj->dFeasTol * dPrimalInfeasObj)
      primalCode = INFEASIBLE;
  }

  return primalCode;
}